

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::GenerateFieldStoreWithTypeChange
          (Lowerer *this,Instr *instrStFld,PropertySymOpnd *propertySymOpnd,
          JITTypeHolder initialType,JITTypeHolder finalType)

{
  Sym *pSVar1;
  code *pcVar2;
  JITTypeHolderBase<void> type;
  bool bVar3;
  TypeId typeId;
  PropertyId PVar4;
  JITType *pJVar5;
  undefined4 *puVar6;
  intptr_t address;
  AddrOpnd *src;
  RegOpnd *baseOpnd;
  IndirOpnd *dst;
  JITTypeHandler *this_00;
  IntConstOpnd *opndArg;
  Instr *instr;
  JITTypeHolderBase<void> local_48;
  JITTypeHolder initialType_local;
  JITTypeHolderBase<void> local_38;
  JITTypeHolder finalType_local;
  
  local_48.t = initialType.t;
  local_38.t = finalType.t;
  GenerateAdjustSlots(this,instrStFld,propertySymOpnd,initialType,finalType);
  pJVar5 = JITTypeHolderBase<void>::operator->(&local_38);
  typeId = JITType::GetTypeId(pJVar5);
  bVar3 = Js::DynamicType::Is(typeId);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2078,"(Js::DynamicType::Is(finalType->GetTypeId()))",
                       "Js::DynamicType::Is(finalType->GetTypeId())");
    if (!bVar3) goto LAB_005d4751;
    *puVar6 = 0;
  }
  type.t = (Type)local_38;
  pSVar1 = (propertySymOpnd->super_SymOpnd).m_sym;
  if (pSVar1->m_kind != SymKindProperty) {
    AssertCount = AssertCount + 1;
    initialType_local.t = (Type)propertySymOpnd;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
    if (!bVar3) {
LAB_005d4751:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    propertySymOpnd = (PropertySymOpnd *)initialType_local;
  }
  PinTypeRef(this,(JITTypeHolder)type.t,type.t,instrStFld,*(PropertyId *)&pSVar1[1]._vptr_Sym);
  pJVar5 = JITTypeHolderBase<void>::operator->(&local_38);
  address = JITType::GetAddr(pJVar5);
  src = IR::AddrOpnd::New(address,AddrOpndKindDynamicType,instrStFld->m_func,true,(Var)0x0);
  baseOpnd = IR::SymOpnd::CreatePropertyOwnerOpnd
                       (&propertySymOpnd->super_SymOpnd,instrStFld->m_func);
  dst = IR::IndirOpnd::New(baseOpnd,8,TyInt64,instrStFld->m_func,false);
  InsertMove(&dst->super_Opnd,&src->super_Opnd,instrStFld,true);
  GenerateDirectFieldStore(this,instrStFld,propertySymOpnd);
  pJVar5 = JITTypeHolderBase<void>::operator->(&local_48);
  this_00 = JITType::GetTypeHandler(pJVar5);
  bVar3 = JITTypeHandler::IsPrototype(this_00);
  if (bVar3) {
    LoadScriptContext(this,instrStFld);
    PVar4 = IR::PropertySymOpnd::GetPropertyId(propertySymOpnd);
    opndArg = IR::IntConstOpnd::New((long)PVar4,TyInt32,this->m_func,true);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instrStFld,&opndArg->super_Opnd);
    instr = IR::Instr::New(Call,this->m_func);
    IR::Instr::InsertBefore(instrStFld,instr);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,instr,HelperInvalidateProtoCaches,(LabelInstr *)0x0,(Opnd *)0x0,
               (PropertySymOpnd *)0x0,false);
  }
  return;
}

Assistant:

void
Lowerer::GenerateFieldStoreWithTypeChange(IR::Instr * instrStFld, IR::PropertySymOpnd *propertySymOpnd, JITTypeHolder initialType, JITTypeHolder finalType)
{
    // Adjust instance slots, if necessary.
    this->GenerateAdjustSlots(instrStFld, propertySymOpnd, initialType, finalType);

    // We should never add properties to objects of static types.
    Assert(Js::DynamicType::Is(finalType->GetTypeId()));

    // Let's pin the final type to be sure its alive when we try to do the type transition.
    PinTypeRef(finalType, finalType.t, instrStFld, propertySymOpnd->m_sym->AsPropertySym()->m_propertyId);
    IR::Opnd *finalTypeOpnd = IR::AddrOpnd::New(finalType->GetAddr(), IR::AddrOpndKindDynamicType, instrStFld->m_func, true);

    // Set the new type.
    IR::RegOpnd *baseOpnd = propertySymOpnd->CreatePropertyOwnerOpnd(instrStFld->m_func);
    IR::Opnd *opnd = IR::IndirOpnd::New(baseOpnd, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, instrStFld->m_func);
    this->InsertMove(opnd, finalTypeOpnd, instrStFld);

    // Now do the store.
    GenerateDirectFieldStore(instrStFld, propertySymOpnd);

    bool isPrototypeTypeHandler = initialType->GetTypeHandler()->IsPrototype();
    if (isPrototypeTypeHandler)
    {
        LoadScriptContext(instrStFld);
        m_lowererMD.LoadHelperArgument(instrStFld, IR::IntConstOpnd::New(propertySymOpnd->GetPropertyId(), TyInt32, m_func, true));
        IR::Instr * invalidateCallInstr = IR::Instr::New(Js::OpCode::Call, m_func);
        instrStFld->InsertBefore(invalidateCallInstr);
        m_lowererMD.ChangeToHelperCall(invalidateCallInstr, IR::HelperInvalidateProtoCaches);
    }
}